

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

ssize_t __thiscall r_code::SysObject::read(SysObject *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  uint uVar2;
  iterator __position;
  iterator iVar3;
  uint32_t *puVar4;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  SysView *this_00;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  Atom local_4c;
  uint32_t *local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  local_48 = (uint32_t *)CONCAT44(in_register_00000034,__fd);
  this->oid = *local_48;
  uVar1 = local_48[1];
  uVar2 = local_48[2];
  uVar5 = (ulong)local_48[3];
  uVar9 = (ulong)local_48[4];
  local_38 = uVar5;
  if ((ulong)uVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      Atom::Atom(&local_4c,local_48[uVar6 + 5]);
      __position._M_current =
           (this->super_ImageObject).code.m_vector.
           super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_ImageObject).code.m_vector.
          super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<r_code::Atom,std::allocator<r_code::Atom>>::
        _M_realloc_insert<r_code::Atom_const&>
                  ((vector<r_code::Atom,std::allocator<r_code::Atom>> *)
                   &(this->super_ImageObject).code,__position,&local_4c);
      }
      else {
        (__position._M_current)->atom = local_4c.atom;
        (this->super_ImageObject).code.m_vector.
        super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      Atom::~Atom(&local_4c);
      uVar6 = uVar6 + 1;
      uVar5 = extraout_RAX;
    } while (uVar1 != uVar6);
  }
  puVar4 = local_48;
  if ((ulong)uVar2 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      local_40 = puVar4[uVar6 + uVar7 + 5];
      uVar5 = (ulong)local_40;
      iVar3._M_current =
           (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->super_ImageObject).references.m_vector.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(this->super_ImageObject).references,iVar3,&local_40);
        uVar5 = extraout_RAX_00;
      }
      else {
        *iVar3._M_current = local_40;
        (this->super_ImageObject).references.m_vector.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  puVar4 = local_48;
  if (local_38 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    do {
      local_3c = puVar4[uVar6 + uVar7 + uVar10 + 5];
      uVar5 = (ulong)local_3c;
      iVar3._M_current =
           (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->markers,iVar3,
                   &local_3c);
        uVar5 = extraout_RAX_01;
      }
      else {
        *iVar3._M_current = local_3c;
        (this->markers).m_vector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar10 = uVar10 + 1;
    } while (local_38 != uVar10);
  }
  puVar4 = local_48;
  if (uVar9 != 0) {
    lVar8 = 0;
    do {
      this_00 = (SysView *)operator_new(0x38);
      SysView::SysView(this_00);
      (*(this_00->super_ImageObject)._vptr_ImageObject[3])
                (this_00,puVar4 + uVar6 + uVar7 + uVar10 + lVar8 + 5);
      vector<r_code::SysView_*>::push_back(&this->views,this_00);
      uVar5 = ((long)(this_00->super_ImageObject).code.m_vector.
                     super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_00->super_ImageObject).code.m_vector.
                     super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + lVar8;
      lVar8 = ((long)(this_00->super_ImageObject).references.m_vector.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_00->super_ImageObject).references.m_vector.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2) + uVar5 + 2;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return uVar5;
}

Assistant:

void SysObject::read(uint32_t *data)
{
    oid = data[0];
    size_t code_size = data[1];
    size_t reference_set_size = data[2];
    size_t marker_set_size = data[3];
    size_t view_set_size = data[4];
    size_t i;
    size_t j;
    size_t k;
    size_t l;

    for (i = 0; i < code_size; ++i) {
        code.push_back(Atom(data[5 + i]));
    }

    for (j = 0; j < reference_set_size; ++j) {
        references.push_back(data[5 + i + j]);
    }

    for (k = 0; k < marker_set_size; ++k) {
        markers.push_back(data[5 + i + j + k]);
    }

    size_t offset = 0;

    for (l = 0; l < view_set_size; ++l) {
        SysView *v = new SysView();
        v->read(data + 5 + i + j + k + offset);
        views.push_back(v);
        offset += v->get_size();
    }
}